

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.cc
# Opt level: O1

void __thiscall Encoder::Resize(Encoder *this,size_t N)

{
  size_t sVar1;
  S2LogMessage local_20;
  
  sVar1 = length(this);
  if (sVar1 < N) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
               ,0x50,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,"Check failed: length() >= N ",0x1c);
    abort();
  }
  this->buf_ = this->orig_ + N;
  sVar1 = length(this);
  if (sVar1 == N) {
    return;
  }
  __assert_fail("length() == N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
                ,0x52,"void Encoder::Resize(size_t)");
}

Assistant:

void Encoder::Resize(size_t N) {
  S2_CHECK(length() >= N);
  buf_ = orig_ + N;
  assert(length() == N);
}